

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status handle_port(char *portStr,size_t portStrLen,curi_settings *settings,void *userData)

{
  uint uVar1;
  int iVar2;
  curi_status local_2c;
  uint value;
  curi_status status;
  void *userData_local;
  curi_settings *settings_local;
  size_t portStrLen_local;
  char *portStr_local;
  
  local_2c = handle_str_callback(settings->portStr_callback,portStr,portStrLen,settings,userData);
  if (((local_2c == curi_status_success) && (portStrLen != 0)) &&
     (settings->port_callback != (_func_int_void_ptr_uint *)0x0)) {
    uVar1 = atoi(portStr);
    iVar2 = (*settings->port_callback)(userData,uVar1);
    if (iVar2 == 0) {
      local_2c = curi_status_canceled;
    }
  }
  return local_2c;
}

Assistant:

static curi_status handle_port(const char* portStr, size_t portStrLen, const curi_settings* settings, void* userData)
{
    curi_status status = handle_str_callback(settings->portStr_callback, portStr, portStrLen, settings, userData);

    if (status == curi_status_success)
    {
        if (portStrLen > 0 && settings->port_callback)
        {
            unsigned int value = atoi(portStr); // Should work because there is no number after the port in URIs
            if(settings->port_callback(userData, value) == 0)
                status =  curi_status_canceled;
        }
    }

    return status ;
}